

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBackgroundBorder.cpp
# Opt level: O3

void __thiscall
Rml::GeometryBackgroundBorder::DrawPointPoint
          (GeometryBackgroundBorder *this,Vector2f pos_outer,Vector2f pos_inner,
          ColourbPremultiplied color0,ColourbPremultiplied color1)

{
  vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *pvVar1;
  
  if ((color0.red == color1.red) && (color0._1_2_ == color1._1_2_)) {
    pvVar1 = this->vertices;
    ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::reserve
              (pvVar1,(long)(int)((int)((ulong)((long)(pvVar1->
                                                  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(pvVar1->
                                                  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 2)
                                  * -0x33333333 +
                                  (uint)(0xffffff < ((uint)color1 ^ (uint)color0)) * 2 + 2));
    DrawPoint(this,pos_inner,color0);
    DrawPoint(this,pos_outer,color0);
    if (((uint)color1 ^ (uint)color0) < 0x1000000) {
      return;
    }
  }
  else {
    pvVar1 = this->vertices;
    ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::reserve
              (pvVar1,(long)((int)((ulong)((long)(pvVar1->
                                                 super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                                                 )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pvVar1->
                                                super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                                                )._M_impl.super__Vector_impl_data._M_start) >> 2) *
                             -0x33333333 + 4));
    DrawPoint(this,pos_inner,color0);
    DrawPoint(this,pos_outer,color0);
  }
  DrawPoint(this,pos_inner,color1);
  DrawPoint(this,pos_outer,color1);
  return;
}

Assistant:

void GeometryBackgroundBorder::DrawPointPoint(Vector2f pos_outer, Vector2f pos_inner, ColourbPremultiplied color0, ColourbPremultiplied color1)
{
	const bool different_color = (color0 != color1);

	vertices.reserve((int)vertices.size() + (different_color ? 4 : 2));

	DrawPoint(pos_inner, color0);
	DrawPoint(pos_outer, color0);

	if (different_color)
	{
		DrawPoint(pos_inner, color1);
		DrawPoint(pos_outer, color1);
	}
}